

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O2

UINT32 ay8910_start(void **chip,UINT32 clock,UINT8 ay_type,UINT8 ay_flags)

{
  byte bVar1;
  undefined1 uVar2;
  UINT32 UVar3;
  void *chip_00;
  undefined1 uVar4;
  long lVar5;
  undefined8 uVar6;
  ay_ym_param *paVar7;
  undefined4 uVar8;
  ay_ym_param *paVar9;
  long lVar10;
  long lVar11;
  
  chip_00 = calloc(1,0x2f8);
  if (chip_00 == (void *)0x0) {
    return 0;
  }
  *chip = chip_00;
  *(UINT32 *)((long)chip_00 + 0x2e0) = clock;
  *(UINT8 *)((long)chip_00 + 0x2e5) = ay_flags;
  *(UINT8 *)((long)chip_00 + 0x2e4) = ay_type;
  bVar1 = 0x10;
  if ((ay_type & 0xf0) != 0x20) {
    bVar1 = ay_type;
  }
  if (0x13 < bVar1) {
switchD_00147d75_caseD_5:
    lVar5 = 0;
    *(uint *)((long)chip_00 + 0x20) = (uint)(0xf < bVar1);
    *(undefined2 *)((long)chip_00 + 0x24) = 0x203;
    if (0xf >= bVar1) goto LAB_00147dd8;
    goto LAB_00147da1;
  }
  lVar5 = (long)&switchD_00147d75::switchdataD_00166e70 +
          (long)(int)(&switchD_00147d75::switchdataD_00166e70)[bVar1];
  switch(bVar1) {
  case 0:
  case 3:
  case 4:
    *(undefined2 *)((long)chip_00 + 0x24) = 0x203;
    break;
  case 1:
    *(undefined2 *)((long)chip_00 + 0x24) = 0x103;
    break;
  case 2:
    *(undefined1 *)((long)chip_00 + 0x24) = 3;
    break;
  default:
    goto switchD_00147d75_caseD_5;
  case 0x10:
  case 0x11:
    uVar2 = 2;
    uVar4 = 3;
    goto LAB_00147d94;
  case 0x12:
  case 0x13:
    uVar4 = 1;
    uVar2 = 0;
LAB_00147d94:
    *(undefined4 *)((long)chip_00 + 0x20) = 1;
    *(undefined1 *)((long)chip_00 + 0x24) = uVar4;
    *(undefined1 *)((long)chip_00 + 0x25) = uVar2;
LAB_00147da1:
    uVar2 = 0x1f;
    paVar9 = &ym2149_param_env;
    paVar7 = &ym2149_param;
    uVar8 = 1;
    uVar6 = 0;
    goto LAB_00147de9;
  }
LAB_00147dd8:
  uVar2 = 0xf;
  uVar6 = CONCAT71((int7)((ulong)lVar5 >> 8),1);
  paVar7 = &ay8910_param;
  uVar8 = 2;
  paVar9 = &ay8910_param;
LAB_00147de9:
  *(undefined4 *)((long)chip_00 + 0x68) = uVar8;
  *(ay_ym_param **)((long)chip_00 + 0x70) = paVar7;
  *(ay_ym_param **)((long)chip_00 + 0x78) = paVar9;
  *(char *)((long)chip_00 + 0x6c) = (char)uVar6;
  *(undefined1 *)((long)chip_00 + 100) = uVar2;
  *(undefined4 *)((long)chip_00 + 0x2cc) = 1000;
  *(undefined8 *)((long)chip_00 + 0x2c4) = 0x3e8000003e8;
  *(byte *)((long)chip_00 + 0x2d0) = (byte)~ay_flags >> 6 | 1;
  *(undefined1 *)((long)chip_00 + 0x2d1) = 3;
  *(byte *)((long)chip_00 + 0x2d2) = (byte)~ay_flags >> 7 | 2;
  lVar5 = (long)chip_00 + 0x80;
  lVar11 = (long)chip_00 + 0x140;
  for (lVar10 = 0xb1; lVar10 != 0xb4; lVar10 = lVar10 + 1) {
    build_single_table((double)*(int *)((long)chip_00 + lVar10 * 4),
                       *(ay_ym_param **)((long)chip_00 + 0x70),(int)lVar5,
                       (INT32 *)(ulong)*(byte *)((long)chip_00 + 0x6c),(int)uVar6);
    build_single_table((double)*(int *)((long)chip_00 + lVar10 * 4),
                       *(ay_ym_param **)((long)chip_00 + 0x78),(int)lVar11,(INT32 *)0x0,(int)uVar6);
    lVar11 = lVar11 + 0x80;
    lVar5 = lVar5 + 0x40;
  }
  ay8910_set_mute_mask(chip_00,0);
  UVar3 = ay8910_get_sample_rate(chip_00);
  return UVar3;
}

Assistant:

UINT32 ay8910_start(void **chip, UINT32 clock, UINT8 ay_type, UINT8 ay_flags)
{
	ay8910_context *info;

	info = (ay8910_context*)calloc(1, sizeof(ay8910_context));
	if (info == NULL)
		return 0;
	*chip = info;

	info->SmpRateFunc = NULL;

	info->clock = clock;
	info->chip_flags = ay_flags;
	ay8910_set_type(info, ay_type);
	info->res_load[0] = info->res_load[1] = info->res_load[2] = 1000; //Default values for resistor loads
	
	if (info->chip_flags & AY8910_ZX_STEREO)
	{
		// ABC Stereo
		info->StereoMask[0] = 0x01;
		info->StereoMask[1] = 0x03;
		info->StereoMask[2] = 0x02;
	}
	else
	{
		info->StereoMask[0] = 0x03;
		info->StereoMask[1] = 0x03;
		info->StereoMask[2] = 0x03;
	}

	build_mixer_table(info);

	//ay8910_set_clock(info, clock);
	ay8910_set_mute_mask(info, 0x00);

	return ay8910_get_sample_rate(info);
}